

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

void duckdb::UniqueFunctor::
     ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long lVar1;
  long lVar2;
  long lVar3;
  idx_t iVar4;
  idx_t iVar5;
  undefined8 uVar6;
  UnifiedVectorFormat sdata;
  long *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_68);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  if (count != 0) {
    lVar1 = *(long *)(result + 0x20);
    lVar2 = *local_68;
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if (lVar2 != 0) {
        iVar5 = (idx_t)*(uint *)(lVar2 + iVar4 * 4);
      }
      lVar3 = **(long **)(local_60 + iVar5 * 8);
      if (lVar3 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(undefined8 *)(lVar3 + 0x20);
      }
      *(undefined8 *)(lVar1 + iVar4 * 8) = uVar6;
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  duckdb::Vector::Verify((ulong)result);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto result_data = FlatVector::GetData<uint64_t>(result);
		for (idx_t i = 0; i < count; i++) {

			auto state = states[sdata.sel->get_index(i)];

			if (!state->hist) {
				result_data[i] = 0;
				continue;
			}
			result_data[i] = state->hist->size();
		}
		result.Verify(count);
	}